

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbif.cpp
# Opt level: O3

vm_obj_id_t CVmBif::get_charset_obj(vm_val_t *val)

{
  int iVar1;
  vm_obj_id_t vVar2;
  ushort *puVar3;
  
  if ((val->typ == VM_OBJ) &&
     (iVar1 = (**(code **)(*(long *)&G_obj_table_X.pages_[(val->val).obj >> 0xc]
                                     [(val->val).obj & 0xfff].ptr_ + 8))
                        (G_obj_table_X.pages_[(val->val).obj >> 0xc] + ((val->val).obj & 0xfff),
                         CVmObjCharSet::metaclass_reg_), iVar1 != 0)) {
    return (val->val).obj;
  }
  puVar3 = (ushort *)vm_val_t::get_as_string(val);
  if (puVar3 != (ushort *)0x0) {
    vVar2 = CVmObjCharSet::create(0,(char *)(puVar3 + 1),(ulong)*puVar3);
    return vVar2;
  }
  if (val->typ == VM_NIL) {
    return 0;
  }
  err_throw(0x900);
}

Assistant:

vm_obj_id_t CVmBif::get_charset_obj(VMG_ const vm_val_t *val)
{
    const char *str;

    /* 
     *   check to see if it's a CharacterSet object; if it's not, it must be
     *   a string giving the character set name 
     */
    if (val->typ == VM_OBJ && CVmObjCharSet::is_charset(vmg_ val->val.obj))
    {
        /* it's a CharacterSet object - return it */
        return val->val.obj;
    }
    else if ((str = val->get_as_string(vmg0_)) != 0)
    {
        /* it's a string - create a mapper for the given character set name */
        return CVmObjCharSet::create(
            vmg_ FALSE, str + VMB_LEN, vmb_get_len(str));
    }
    else if (val->typ == VM_NIL)
    {
        /* nil simply means no character set */
        return VM_INVALID_OBJ;
    }
    else
    {
        /* invalid argument */
        err_throw(VMERR_BAD_TYPE_BIF);
        AFTER_ERR_THROW(return VM_INVALID_OBJ);
    }
}